

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order6f
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  sunrealtype *z;
  size_t __nmemb;
  sunrealtype bAAcAc;
  
  __nmemb = (size_t)s;
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  b_01 = (sunrealtype *)calloc(__nmemb,8);
  z = (sunrealtype *)calloc(__nmemb,8);
  iVar1 = arkode_butcher_mv(A2,c1,s,b_00);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A1,b_00,s,b_01), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_mv(A3,c2,s,b_00), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_vv(b_00,b_01,s,z), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(b,z,s,&bAAcAc);
    if (iVar1 != 0) {
      return 0;
    }
    free(b_00);
    free(b_01);
    free(z);
    return (uint)(ABS(bAAcAc + -0.013888888888888888) <= 1.4901161193847656e-08);
  }
  free(b_00);
  free(b_01);
  free(z);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6f(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bAAcAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp3 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A2, c1, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(tmp1, tmp2, s, tmp3))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp3, s, &bAAcAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  free(tmp3);
  return (SUNRabs(bAAcAc - SUN_RCONST(1.0) / SUN_RCONST(72.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}